

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_iris.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Dataset *d)

{
  bool bVar1;
  reference __v;
  ostream *poVar2;
  undefined1 local_40 [8];
  valarray<float> v;
  const_iterator __end1;
  const_iterator __begin1;
  Dataset *__range1;
  Dataset *d_local;
  ostream *out_local;
  
  __end1 = notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::
           begin(d);
  v._M_data = (float *)notch::core::std::
                       vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::end(d);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::valarray<float>_*,_std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>_>
                                *)&v._M_data);
    if (!bVar1) break;
    __v = __gnu_cxx::
          __normal_iterator<const_std::valarray<float>_*,_std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>_>
          ::operator*(&__end1);
    notch::core::std::valarray<float>::valarray((valarray<float> *)local_40,__v);
    poVar2 = notch::io::operator<<(out,(valarray<float> *)local_40);
    std::operator<<(poVar2,"\n");
    notch::core::std::valarray<float>::~valarray((valarray<float> *)local_40);
    __gnu_cxx::
    __normal_iterator<const_std::valarray<float>_*,_std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>_>
    ::operator++(&__end1);
  }
  return out;
}

Assistant:

ostream &operator<<(ostream &out, const Dataset &d) {
    for (auto v : d) {
        out << v << "\n";
    }
    return out;
}